

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall QCborStreamReader::preparse(QCborStreamReader *this)

{
  QCborStreamReader QVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint64_t uVar4;
  
  plVar2 = *(long **)(this + 8);
  if ((int)plVar2[0xc] == 0) {
    QVar1 = *(QCborStreamReader *)((long)plVar2 + 0x5e);
    this[0x10] = QVar1;
    if (QVar1 == (QCborStreamReader)0xff) {
      if ((*plVar2 != 0) && (plVar2[6] == 0)) {
        QByteArray::clear((QByteArray *)(plVar2 + 1));
        puVar3 = *(undefined8 **)(this + 8);
        if (puVar3[0xd] != 0) {
          QIODevice::skip((QIODevice *)*puVar3,puVar3[0xd]);
          puVar3 = *(undefined8 **)(this + 8);
        }
        puVar3[0xd] = 0;
      }
    }
    else {
      *(undefined4 *)(plVar2 + 0xc) = 0;
      if ((byte)((char)QVar1 + 0xbU) < 3) {
        this[0x10] = (QCborStreamReader)0xe0;
        *(ulong *)this = (ulong)*(byte *)(plVar2[2] + plVar2[0xd]) - 0xe0;
      }
      else {
        uVar4 = _cbor_value_extract_int64_helper((CborValue *)(plVar2 + 9));
        *(uint64_t *)this = uVar4;
        if ((QVar1 == (QCborStreamReader)0x0) && ((*(byte *)((long)plVar2 + 0x5f) & 4) != 0)) {
          this[0x10] = (QCborStreamReader)0x20;
        }
      }
    }
  }
  else {
    this[0x10] = (QCborStreamReader)0xff;
  }
  return;
}

Assistant:

inline void QCborStreamReader::preparse()
{
    if (lastError() == QCborError::NoError) {
        type_ = cbor_value_get_type(&d->currentElement);

        if (type_ == CborInvalidType) {
            // We may have reached the end.
            if (d->device && d->containerStack.isEmpty()) {
                d->buffer.clear();
                if (d->bufferStart)
                    d->device->skip(d->bufferStart);
                d->bufferStart = 0;
            }
        } else {
            d->lastError = {};
            // Undo the type mapping that TinyCBOR does (we have an explicit type
            // for negative integer and we don't have separate types for Boolean,
            // Null and Undefined).
            if (type_ == CborBooleanType || type_ == CborNullType || type_ == CborUndefinedType) {
                type_ = CborSimpleType;
                value64 = quint8(d->buffer.at(d->bufferStart)) - CborSimpleType;
            } else {
                // Using internal TinyCBOR API!
                value64 = _cbor_value_extract_int64_helper(&d->currentElement);

                if (cbor_value_is_negative_integer(&d->currentElement))
                    type_ = quint8(QCborStreamReader::NegativeInteger);
            }
        }
    } else {
        type_ = Invalid;
    }
}